

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_armlet_skip.hpp
# Opt level: O0

void __thiscall PatchFixArmletSkip::alter_world(PatchFixArmletSkip *this,World *world)

{
  Map *this_00;
  Entity *this_01;
  World *world_local;
  PatchFixArmletSkip *this_local;
  
  this_00 = World::map(world,0x1db);
  this_01 = Map::entity(this_00,'\t');
  Entity::can_pass_through(this_01,true);
  return;
}

Assistant:

void alter_world(World& world) override
    {
        // Make Mir Tower magic barrier non-colliding
        world.map(MAP_MIR_TOWER_EXTERIOR)->entity(9)->can_pass_through(true);
    }